

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O3

void Amap_ManMerge(Amap_Man_t *p)

{
  Amap_Obj_t *pNode;
  int iVar1;
  Amap_Cut_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  uint uVar5;
  int level;
  long lVar6;
  timespec ts;
  timespec local_28;
  
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  pAVar2 = Amap_ManSetupPis(p);
  p->pCutsPi = pAVar2;
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      pNode = (Amap_Obj_t *)pVVar3->pArray[lVar6];
      if ((pNode != (Amap_Obj_t *)0x0) &&
         (((undefined1  [96])*pNode & (undefined1  [96])0x6) == (undefined1  [96])0x4 ||
          ((undefined1  [96])*pNode & (undefined1  [96])0x7) == (undefined1  [96])0x6)) {
        Amap_ManMergeNodeCuts(p,pNode);
        pVVar3 = p->vObjs;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar3->nSize);
  }
  if (p->pPars->fVerbose != 0) {
    printf("AIG object is %d bytes.  ",0x60);
    printf("Internal AIG = %5.2f MB.  Cuts = %5.2f MB.  CutsMax = %d.\n",
           (double)p->vObjs->nSize * 96.0 * 9.5367431640625e-07,
           (double)p->nBytesUsed * 9.5367431640625e-07,(ulong)(uint)p->pPars->nCutsMax);
    uVar5 = p->nObjs[5] + p->nObjs[4] + p->nObjs[6];
    iVar1 = 0x98c72c;
    printf("Node =%6d. Try =%9d. Try3 =%10d. Used =%7d. R =%6.2f.  ",
           (double)p->nCutsUsed / (double)(int)uVar5,(ulong)uVar5,(ulong)(uint)p->nCutsTried,
           (ulong)(uint)p->nCutsTried3);
    Abc_Print(iVar1,"%s =","Time ");
    level = 3;
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar6 + lVar4) / 1000000.0);
  }
  return;
}

Assistant:

void Amap_ManMerge( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    p->pCutsPi = Amap_ManSetupPis( p );
    Amap_ManForEachNode( p, pObj, i )
        Amap_ManMergeNodeCuts( p, pObj );
    if ( p->pPars->fVerbose )
    {
        printf( "AIG object is %d bytes.  ", (int)sizeof(Amap_Obj_t) );
        printf( "Internal AIG = %5.2f MB.  Cuts = %5.2f MB.  CutsMax = %d.\n", 
            1.0*Amap_ManObjNum(p)*sizeof(Amap_Obj_t)/(1<<20), 1.0*p->nBytesUsed/(1<<20), p->pPars->nCutsMax );
        printf( "Node =%6d. Try =%9d. Try3 =%10d. Used =%7d. R =%6.2f.  ", 
            Amap_ManNodeNum(p), p->nCutsTried, p->nCutsTried3, p->nCutsUsed, 
            1.0*p->nCutsUsed/Amap_ManNodeNum(p) );
ABC_PRT( "Time ", Abc_Clock() - clk );
    }
}